

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall cmm::ReturnStatementAST::dump(ReturnStatementAST *this,string *prefix)

{
  ExpressionAST *pEVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator<<((ostream *)&std::cout,"return\n");
  if ((this->ReturnValue)._M_t.
      super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
      super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
      super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl != (ExpressionAST *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    std::operator<<(poVar2,"`---");
    pEVar1 = (this->ReturnValue)._M_t.
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    std::operator+(&bStack_38,prefix,"    ");
    (*(pEVar1->super_AST)._vptr_AST[2])(pEVar1,&bStack_38);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  return;
}

Assistant:

void ReturnStatementAST::dump(const std::string &prefix) const {
  std::cout << "return\n";
  if (!ReturnValue)
    return;
  std::cout << prefix << "`---";
  ReturnValue->dump(prefix + "    ");
}